

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O1

void __thiscall
OpenMD::EAMAdapter::makeZhouRose
          (EAMAdapter *this,RealType re,RealType fe,RealType rhoe,RealType alpha,RealType beta,
          RealType A,RealType B,RealType kappa,RealType lambda,RealType F0)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  AtomType *pAVar2;
  bool bVar3;
  EAMParameters eamParam;
  undefined1 local_1d9;
  SimpleTypeData<OpenMD::ZhouParameters> *local_1d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1d0;
  RealType local_1c8;
  RealType local_1c0;
  RealType local_1b8;
  RealType local_1b0;
  RealType local_1a8;
  RealType local_1a0;
  RealType local_198;
  RealType local_190;
  shared_ptr<OpenMD::GenericData> local_188;
  shared_ptr<OpenMD::GenericData> local_178;
  EAMParameters local_160;
  ZhouParameters local_130;
  
  local_1c8 = re;
  local_1c0 = fe;
  local_1b8 = rhoe;
  local_1b0 = alpha;
  local_1a8 = beta;
  local_1a0 = A;
  local_198 = B;
  local_190 = kappa;
  bVar3 = AtomType::hasProperty(this->at_,(string *)OpenMD::EAMtypeID_abi_cxx11_);
  if (bVar3) {
    AtomType::removeProperty(this->at_,(string *)OpenMD::EAMtypeID_abi_cxx11_);
    AtomType::removeProperty(this->at_,(string *)OpenMD::ZhouTypeID_abi_cxx11_);
  }
  paVar1 = &local_160.latticeType.field_2;
  local_160.eamType = eamFuncfl;
  local_160.latticeType._M_string_length = 0;
  local_160.latticeType.field_2._M_local_buf[0] = '\0';
  local_160.latticeConstant = 0.0;
  local_160.latticeType._M_dataplus._M_p = (pointer)paVar1;
  memset(&local_130,0,0x110);
  local_160.eamType = eamZhouRose;
  local_160.latticeConstant = local_1c8;
  local_130.re = local_1c8;
  local_130.fe = local_1c0;
  local_130.rhoe = local_1b8;
  local_130.alpha = local_1b0;
  local_130.beta = local_1a8;
  local_130.A = local_1a0;
  local_130.B = local_198;
  local_130.kappa = local_190;
  local_130.lambda = lambda;
  local_130.F0 = F0;
  pAVar2 = this->at_;
  local_1d8 = (SimpleTypeData<OpenMD::ZhouParameters> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,std::allocator<OpenMD::SimpleTypeData<OpenMD::EAMParameters>>,std::__cxx11::string_const&,OpenMD::EAMParameters&>
            (&_Stack_1d0,(SimpleTypeData<OpenMD::EAMParameters> **)&local_1d8,
             (allocator<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_> *)&local_1d9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             OpenMD::EAMtypeID_abi_cxx11_,&local_160);
  local_178.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1d8->super_GenericData;
  local_178.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_1d0._M_pi;
  local_1d8 = (SimpleTypeData<OpenMD::ZhouParameters> *)0x0;
  _Stack_1d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AtomType::addProperty(pAVar2,&local_178);
  if (local_178.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1d0._M_pi);
  }
  pAVar2 = this->at_;
  local_1d8 = (SimpleTypeData<OpenMD::ZhouParameters> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>,std::allocator<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>>,std::__cxx11::string_const&,OpenMD::ZhouParameters&>
            (&_Stack_1d0,&local_1d8,
             (allocator<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>_> *)&local_1d9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             OpenMD::ZhouTypeID_abi_cxx11_,&local_130);
  local_188.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1d8->super_GenericData;
  local_188.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_1d0._M_pi;
  local_1d8 = (SimpleTypeData<OpenMD::ZhouParameters> *)0x0;
  _Stack_1d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AtomType::addProperty(pAVar2,&local_188);
  if (local_188.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1d0._M_pi);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_130.OF);
  if (local_130.OrhoE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.OrhoE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.OrhoE.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.OrhoE.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_130.OrhoLimits.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.OrhoLimits.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_130.OrhoLimits.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.OrhoLimits.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_130.Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_130.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.latticeType._M_dataplus._M_p != paVar1) {
    operator_delete(local_160.latticeType._M_dataplus._M_p,
                    CONCAT71(local_160.latticeType.field_2._M_allocated_capacity._1_7_,
                             local_160.latticeType.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void EAMAdapter::makeZhouRose(RealType re, RealType fe, RealType rhoe,
                                RealType alpha, RealType beta, RealType A,
                                RealType B, RealType kappa, RealType lambda,
                                RealType F0) {
    if (isEAM()) {
      at_->removeProperty(EAMtypeID);
      at_->removeProperty(ZhouTypeID);
    }

    EAMParameters eamParam {};
    ZhouParameters zhouParam {};

    eamParam.eamType         = eamZhouRose;
    eamParam.latticeConstant = re;
    zhouParam.re             = re;
    zhouParam.fe             = fe;
    zhouParam.rhoe           = rhoe;
    zhouParam.alpha          = alpha;
    zhouParam.beta           = beta;
    zhouParam.A              = A;
    zhouParam.B              = B;
    zhouParam.kappa          = kappa;
    zhouParam.lambda         = lambda;
    zhouParam.F0             = F0;

    at_->addProperty(std::make_shared<EAMData>(EAMtypeID, eamParam));
    at_->addProperty(std::make_shared<ZhouData>(ZhouTypeID, zhouParam));
  }